

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O3

ON_ModelComponentReference __thiscall
ONX_Model::AddModelGeometryComponent
          (ONX_Model *this,ON_Object *geometry_object,ON_3dmObjectAttributes *attributes,
          bool bResolveIdAndNameConflicts)

{
  ON_UUID *b;
  bool bVar1;
  undefined1 bManageAttributes;
  ON_Geometry *pOVar2;
  ON_3dmObjectAttributes *this_00;
  undefined7 in_register_00000009;
  ON_3dmObjectAttributes *src;
  char *sFormat;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  int line_number;
  char in_R8B;
  ON_ModelComponentReference OVar5;
  ON_UUID id;
  ON_UUID local_48;
  ON_Object *pOVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  src = (ON_3dmObjectAttributes *)CONCAT71(in_register_00000009,bResolveIdAndNameConflicts);
  pOVar2 = ON_Geometry::Cast(&attributes->super_ON_Object);
  if (pOVar2 == (ON_Geometry *)0x0) {
    sFormat = "Invalid geometry_object parameter.";
    line_number = 0x618;
LAB_00462c67:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
               ,line_number,"",sFormat);
    ON_ModelComponentReference::ON_ModelComponentReference
              ((ON_ModelComponentReference *)this,&ON_ModelComponentReference::Empty);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    local_48.Data1 = 0;
    local_48.Data2 = 0;
    local_48.Data3 = 0;
    local_48.Data4[0] = '\0';
    local_48.Data4[1] = '\0';
    local_48.Data4[2] = '\0';
    local_48.Data4[3] = '\0';
    local_48.Data4[4] = '\0';
    local_48.Data4[5] = '\0';
    local_48.Data4[6] = '\0';
    local_48.Data4[7] = '\0';
    if (src == (ON_3dmObjectAttributes *)0x0) {
      pOVar3 = ON_Object::Duplicate(&attributes->super_ON_Object);
      bManageAttributes = SUB81(pOVar3,0);
      this_00 = (ON_3dmObjectAttributes *)0x0;
    }
    else {
      b = &src->m_uuid;
      bVar1 = ::operator!=(&ON_nil_uuid,b);
      if (bVar1) {
        bVar1 = ON_ComponentManifest::IdIsAvailable
                          ((ON_ComponentManifest *)(geometry_object + 0x8d),src->m_uuid);
        if (bVar1) {
          local_48.Data1 = b->Data1;
          local_48.Data2 = b->Data2;
          local_48.Data3 = b->Data3;
          local_48.Data4 = *&(src->m_uuid).Data4;
        }
        else if (in_R8B == '\0') {
          sFormat = "attributes->m_uuid is invalid or in use in this model.";
          line_number = 0x623;
          goto LAB_00462c67;
        }
      }
      pOVar3 = ON_Object::Duplicate(&attributes->super_ON_Object);
      bManageAttributes = SUB81(pOVar3,0);
      this_00 = (ON_3dmObjectAttributes *)::operator_new(0x170);
      ON_3dmObjectAttributes::ON_3dmObjectAttributes(this_00,src);
      (this_00->m_uuid).Data1 = local_48.Data1;
      (this_00->m_uuid).Data2 = local_48.Data2;
      (this_00->m_uuid).Data3 = local_48.Data3;
      *&(this_00->m_uuid).Data4 = local_48.Data4;
    }
    OVar5 = AddModelGeometryComponentForExperts
                      (this,SUB81(geometry_object,0),(ON_Object *)0x1,(bool)bManageAttributes,
                       (ON_3dmObjectAttributes *)0x1,SUB81(this_00,0));
    _Var4._M_pi = OVar5.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  OVar5.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  OVar5.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ON_ModelComponentReference)
         OVar5.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ON_ModelComponentReference ONX_Model::AddModelGeometryComponent(
  const class ON_Object* geometry_object,
  const class ON_3dmObjectAttributes* attributes,
  bool bResolveIdAndNameConflicts
  )
{
  if ( nullptr == ON_Geometry::Cast(geometry_object) )
  {
    ON_ERROR("Invalid geometry_object parameter.");
    return ON_ModelComponentReference::Empty;
  }

  ON_UUID id = ON_nil_uuid;
  if (nullptr != attributes && ON_nil_uuid != attributes->m_uuid )
  {
    if (m_manifest.IdIsAvailable(attributes->m_uuid))
      id = attributes->m_uuid;
    else if (false == bResolveIdAndNameConflicts)
    {
      ON_ERROR("attributes->m_uuid is invalid or in use in this model.");
      return ON_ModelComponentReference::Empty;
    }
  }

  ON_3dmObjectAttributes* managed_attributes = nullptr;
  ON_Object* managed_geometry_object = geometry_object->Duplicate();
  if (nullptr != attributes)
  {
    managed_attributes = new ON_3dmObjectAttributes(*attributes);
    managed_attributes->m_uuid = id;
  }

  const bool bManageGeometry = true;
  const bool bManageAttributes = true;
  return AddModelGeometryComponentForExperts(
    bManageGeometry,
    managed_geometry_object,
    bManageAttributes,
    managed_attributes,
    bResolveIdAndNameConflicts
  );
}